

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O2

void rcg::convYCbCr411toQuadRGB(uint8_t *rgb,uint8_t *row,int i)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  int j;
  int iVar5;
  int iVar6;
  undefined1 uVar7;
  ulong local_18;
  ulong local_10;
  
  lVar3 = (long)(i >> 2) * 6;
  local_18 = (ulong)CONCAT14((char)(*(ushort *)(row + lVar3) >> 8),
                             (uint)(*(ushort *)(row + lVar3) & 0xff));
  uVar7 = (undefined1)((ushort)*(undefined2 *)(row + lVar3 + 3) >> 8);
  local_10 = (ulong)(CONCAT14(uVar7,(uint)CONCAT12(uVar7,*(undefined2 *)(row + lVar3 + 3))) &
                    0xffffff00ff) & 0xffffffff0000ffff;
  bVar1 = row[lVar3 + 2];
  bVar2 = row[lVar3 + 5];
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    iVar5 = *(int *)((long)&local_18 + lVar3 * 4);
    iVar6 = (((uint)bVar2 * 0x5a + 0x1320 >> 6) - 0x100) + iVar5;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    iVar4 = (((uint)bVar2 * -0x2e + (uint)bVar1 * -0x16 + 0x6220 >> 6) - 0x100) + iVar5;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    if (0xfe < iVar4) {
      iVar4 = 0xff;
    }
    iVar5 = iVar5 + (((uint)bVar1 * 0x71 + 0x7a0 >> 6) - 0x100);
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    *rgb = (uint8_t)iVar6;
    if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    rgb[1] = (uint8_t)iVar4;
    rgb[2] = (uint8_t)iVar5;
    rgb = rgb + 3;
  }
  return;
}

Assistant:

void convYCbCr411toQuadRGB(uint8_t rgb[12], const uint8_t *row, int i)
{
  i=(i>>2)*6;

  const int Y[4]={row[i], row[i+1], row[i+3], row[i+4]};
  const int Cb=static_cast<int>(row[i+2])-128;
  const int Cr=static_cast<int>(row[i+5])-128;

  // conversion of YCbCr into RGB with correct rounding
  const int rc=((90*Cr+16384+32)>>6)-256;
  const int gc=((-22*Cb-46*Cr+16384+32)>>6)-256;
  const int bc=((113*Cb+16384+32)>>6)-256;

  for (int j=0; j<4; j++)
  {
    *rgb++=clamp8(Y[j]+rc);
    *rgb++=clamp8(Y[j]+gc);
    *rgb++=clamp8(Y[j]+bc);
  }
}